

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * duckdb_fmt::v6::internal::
       parse_align<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  char cVar1;
  bool bVar2;
  align_t align;
  ulong uVar3;
  char *pcVar4;
  allocator local_39;
  string local_38;
  
  pcVar4 = begin + 1;
  uVar3 = (ulong)(pcVar4 != end);
  do {
    cVar1 = begin[uVar3];
    if (cVar1 == '<') {
      align = left;
LAB_007c439e:
      if ((int)uVar3 != 0) {
        if (*begin == '{') {
          std::__cxx11::string::string((string *)&local_38,"invalid fill character \'{\'",&local_39)
          ;
          specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                     ,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          return begin;
        }
        pcVar4 = begin + 2;
        (((handler->
          super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->fill).data_[0] = *begin;
      }
      specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
      ::on_align(handler,align);
      return pcVar4;
    }
    if (cVar1 == '^') {
      align = center;
      goto LAB_007c439e;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_007c439e;
    }
    if (cVar1 == '=') {
      align = numeric;
      goto LAB_007c439e;
    }
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}